

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing.h
# Opt level: O3

vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
* __thiscall
phmap::priv::
keys<phmap::flat_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>
          (vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
           *__return_storage_ptr__,priv *this,
          flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
          *s)

{
  char cVar1;
  long lVar2;
  long lVar3;
  iterator __position;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  uint uVar16;
  flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *__range2;
  value_type *v;
  anon_union_8_1_a8a14541_for_iterator_1 aVar17;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar18;
  char *pcVar15;
  
  (__return_storage_ptr__->
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  ::reserve(__return_storage_ptr__,*(size_type *)(this + 0x10));
  iVar18 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
           ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                    *)this);
  pcVar15 = iVar18.ctrl_;
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 0x18);
  while (pcVar15 != (char *)(lVar2 + lVar3)) {
    aVar17 = iVar18.field_1;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
      ::_M_realloc_insert<phmap::priv::hash_internal::EnumClass_const&>
                ((vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
                  *)__return_storage_ptr__,__position,aVar17.slot_);
    }
    else {
      *__position._M_current = *aVar17.slot_;
      (__return_storage_ptr__->
      super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
      )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    aVar17.slot_ = aVar17.slot_ + 1;
    cVar1 = iVar18.ctrl_[1];
    pcVar15 = iVar18.ctrl_ + 1;
    while (cVar1 < -1) {
      iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar15 < (char)iVar7);
      in_XMM1_Bb = -(pcVar15[1] < (char)((uint)iVar7 >> 8));
      in_XMM1_Bc = -(pcVar15[2] < (char)((uint)iVar7 >> 0x10));
      in_XMM1_Bd = -(pcVar15[3] < (char)((uint)iVar7 >> 0x18));
      in_XMM1_Be = -(pcVar15[4] < (char)iVar8);
      in_XMM1_Bf = -(pcVar15[5] < (char)((uint)iVar8 >> 8));
      in_XMM1_Bg = -(pcVar15[6] < (char)((uint)iVar8 >> 0x10));
      in_XMM1_Bh = -(pcVar15[7] < (char)((uint)iVar8 >> 0x18));
      in_XMM1_Bi = -(pcVar15[8] < (char)iVar9);
      in_XMM1_Bj = -(pcVar15[9] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bk = -(pcVar15[10] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bl = -(pcVar15[0xb] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Bm = -(pcVar15[0xc] < (char)iVar10);
      in_XMM1_Bn = -(pcVar15[0xd] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bo = -(pcVar15[0xe] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bp = -(pcVar15[0xf] < (char)((uint)iVar10 >> 0x18));
      auVar5[1] = in_XMM1_Bb;
      auVar5[0] = in_XMM1_Ba;
      auVar5[2] = in_XMM1_Bc;
      auVar5[3] = in_XMM1_Bd;
      auVar5[4] = in_XMM1_Be;
      auVar5[5] = in_XMM1_Bf;
      auVar5[6] = in_XMM1_Bg;
      auVar5[7] = in_XMM1_Bh;
      auVar5[8] = in_XMM1_Bi;
      auVar5[9] = in_XMM1_Bj;
      auVar5[10] = in_XMM1_Bk;
      auVar5[0xb] = in_XMM1_Bl;
      auVar5[0xc] = in_XMM1_Bm;
      auVar5[0xd] = in_XMM1_Bn;
      auVar5[0xe] = in_XMM1_Bo;
      auVar5[0xf] = in_XMM1_Bp;
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bd;
      auVar14[0] = in_XMM1_Bc;
      auVar14[2] = in_XMM1_Be;
      auVar14[3] = in_XMM1_Bf;
      auVar14[4] = in_XMM1_Bg;
      auVar14[5] = in_XMM1_Bh;
      auVar14[6] = in_XMM1_Bi;
      auVar14[7] = in_XMM1_Bj;
      auVar14[8] = in_XMM1_Bk;
      auVar14[9] = in_XMM1_Bl;
      auVar14[10] = in_XMM1_Bm;
      auVar14[0xb] = in_XMM1_Bn;
      auVar14[0xc] = in_XMM1_Bo;
      auVar14[0xd] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Be;
      auVar13[0] = in_XMM1_Bd;
      auVar13[2] = in_XMM1_Bf;
      auVar13[3] = in_XMM1_Bg;
      auVar13[4] = in_XMM1_Bh;
      auVar13[5] = in_XMM1_Bi;
      auVar13[6] = in_XMM1_Bj;
      auVar13[7] = in_XMM1_Bk;
      auVar13[8] = in_XMM1_Bl;
      auVar13[9] = in_XMM1_Bm;
      auVar13[10] = in_XMM1_Bn;
      auVar13[0xb] = in_XMM1_Bo;
      auVar13[0xc] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bf;
      auVar12[0] = in_XMM1_Be;
      auVar12[2] = in_XMM1_Bg;
      auVar12[3] = in_XMM1_Bh;
      auVar12[4] = in_XMM1_Bi;
      auVar12[5] = in_XMM1_Bj;
      auVar12[6] = in_XMM1_Bk;
      auVar12[7] = in_XMM1_Bl;
      auVar12[8] = in_XMM1_Bm;
      auVar12[9] = in_XMM1_Bn;
      auVar12[10] = in_XMM1_Bo;
      auVar12[0xb] = in_XMM1_Bp;
      auVar11[1] = in_XMM1_Bg;
      auVar11[0] = in_XMM1_Bf;
      auVar11[2] = in_XMM1_Bh;
      auVar11[3] = in_XMM1_Bi;
      auVar11[4] = in_XMM1_Bj;
      auVar11[5] = in_XMM1_Bk;
      auVar11[6] = in_XMM1_Bl;
      auVar11[7] = in_XMM1_Bm;
      auVar11[8] = in_XMM1_Bn;
      auVar11[9] = in_XMM1_Bo;
      auVar11[10] = in_XMM1_Bp;
      uVar16 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar4 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      aVar17.slot_ = aVar17.slot_ + uVar4;
      cVar1 = pcVar15[uVar4];
      pcVar15 = pcVar15 + uVar4;
    }
    iVar18.field_1.slot_ = aVar17.slot_;
    iVar18.ctrl_ = pcVar15;
  }
  return __return_storage_ptr__;
}

Assistant:

auto keys(const Set& s)
    -> std::vector<typename std::decay<typename Set::key_type>::type> {
  std::vector<typename std::decay<typename Set::key_type>::type> res;
  res.reserve(s.size());
  for (const auto& v : s) res.emplace_back(v);
  return res;
}